

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O3

GLfloat __thiscall
gl3cts::TextureSizePromotion::FunctionalTest::getMinPrecision
          (FunctionalTest *this,TextureInternalFormatDescriptor descriptor,
          ColorChannelSelector channel)

{
  uint uVar1;
  undefined4 *puVar2;
  float fVar3;
  double dVar4;
  
  if (ALPHA_COMPONENT < channel) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0;
    __cxa_throw(puVar2,&int::typeinfo,0);
  }
  fVar3 = 0.1;
  if (((&descriptor.expected_red_type)[channel] != 0) &&
     (uVar1 = (&descriptor.min_red_size)[channel], fVar3 = 0.1, uVar1 != 0)) {
    if ((descriptor.expected_alpha_type == 0x1406 || descriptor.expected_blue_type == 0x1406) ||
        (descriptor.expected_green_type == 0x1406 || descriptor.expected_red_type == 0x1406)) {
      if (uVar1 - 10 < 7) {
        fVar3 = *(float *)(&DAT_019f10c4 + (ulong)(uVar1 - 10) * 4);
      }
      else {
        fVar3 = 1e-05;
      }
    }
    else {
      if ((descriptor.expected_alpha_type == 0x8f9c || descriptor.expected_blue_type == 0x8f9c) ||
          (descriptor.expected_green_type == 0x8f9c || descriptor.expected_red_type == 0x8f9c)) {
        uVar1 = uVar1 - 1;
      }
      else if ((descriptor.expected_alpha_type != 0x8c17 && descriptor.expected_blue_type != 0x8c17)
               && (descriptor.expected_green_type != 0x8c17 &&
                  descriptor.expected_red_type != 0x8c17)) {
        return 1.0;
      }
      dVar4 = exp2((double)uVar1);
      fVar3 = (float)(1.0 / dVar4);
    }
  }
  return fVar3;
}

Assistant:

glw::GLfloat FunctionalTest::getMinPrecision(TextureInternalFormatDescriptor descriptor, ColorChannelSelector channel)
{
	/* Select channel data. */
	glw::GLenum type = GL_NONE;
	glw::GLuint size = 0;

	switch (channel)
	{
	case RED_COMPONENT:
		type = descriptor.expected_red_type;
		size = descriptor.min_red_size;
		break;
	case GREEN_COMPONENT:
		type = descriptor.expected_green_type;
		size = descriptor.min_green_size;
		break;
	case BLUE_COMPONENT:
		type = descriptor.expected_blue_type;
		size = descriptor.min_blue_size;
		break;
	case ALPHA_COMPONENT:
		type = descriptor.expected_alpha_type;
		size = descriptor.min_alpha_size;
		break;
	default:
		throw 0;
	}

	/* If it is empty channel. */
	if ((type == GL_NONE) || (size == 0))
	{
		return 0.1f;
	}

	/* If float type. */
	if (isFloatType(descriptor))
	{
		switch (size)
		{
		case 32:
			return 0.00001f; /* specification GL4.5 core constant */
		case 16:
			return 1.f / 1024.f; /* specification GL4.5 core 10 bit mantisa constant */
		case 11:
			return 1.f / 64.f; /* specification GL4.5 core 6 bit mantisa constant */
		case 10:
			return 1.f / 32.f; /* specification GL4.5 core 5 bit mantisa constant */
		default:
			return 0.00001f;
		}
	}

	/* Fixed types precision */
	if (isFixedSignedType(descriptor))
	{
		return (float)(1.0 / pow(2.0, (double)(size - 1 /* sign bit */)));
	}

	if (isFixedUnsignedType(descriptor))
	{
		return (float)(1.0 / pow(2.0, (double)(size)));
	}

	/* other aka (unsigned) integer */
	return 1;
}